

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O0

void __thiscall CEPlanet::CEPlanet(CEPlanet *this)

{
  CEBody *in_RDI;
  CEPlanet *in_stack_00000040;
  
  CEBody::CEBody(in_RDI);
  (in_RDI->super_CESkyCoord)._vptr_CESkyCoord = (_func_int **)&PTR__CEPlanet_00150b40;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x138ec8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x138ede);
  *(undefined8 *)&in_RDI[3].super_CESkyCoord.coord_type_ = 0x3eb0c6f7a0b5ed8d;
  init_members(in_stack_00000040);
  return;
}

Assistant:

CEPlanet::CEPlanet() :
    CEBody()
{
    init_members();
}